

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<double> * testing::A<double>(void)

{
  MatcherInterface<double> *pMVar1;
  Matcher<double> *in_RDI;
  
  pMVar1 = (MatcherInterface<double> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001b94f0;
  (in_RDI->super_MatcherBase<double>).impl_.value_ = pMVar1;
  (in_RDI->super_MatcherBase<double>).impl_.link_.next_ =
       &(in_RDI->super_MatcherBase<double>).impl_.link_;
  (in_RDI->super_MatcherBase<double>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001b9458;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }